

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

GeneratedCodeInfo_Annotation *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
          (Arena *arena)

{
  GeneratedCodeInfo_Annotation *this;
  
  if (arena == (Arena *)0x0) {
    this = (GeneratedCodeInfo_Annotation *)operator_new(0x40);
    GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(this);
  }
  else {
    AllocHook(arena,(type_info *)&GeneratedCodeInfo_Annotation::typeinfo,0x40);
    this = (GeneratedCodeInfo_Annotation *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x40);
    GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}